

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.hpp
# Opt level: O3

void __thiscall
jessilib::io::formatted_message::
formatted_message<std::basic_string_view<char8_t,std::char_traits<char8_t>>>
          (formatted_message *this,u8string *in_format,
          basic_string_view<char8_t,_std::char_traits<char8_t>_> *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  initializer_list<jessilib::io::text> __l;
  allocator_type local_51;
  text local_50;
  
  paVar1 = &(this->m_format).field_2;
  (this->m_format)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (in_format->_M_dataplus)._M_p;
  paVar2 = &in_format->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&in_format->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->m_format).field_2 + 8) = uVar4;
  }
  else {
    (this->m_format)._M_dataplus._M_p = pcVar3;
    (this->m_format).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->m_format)._M_string_length = in_format->_M_string_length;
  (in_format->_M_dataplus)._M_p = (pointer)paVar2;
  in_format->_M_string_length = 0;
  (in_format->field_2)._M_local_buf[0] = '\0';
  paVar1 = &local_50.m_string.field_2;
  local_50.m_string._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::u8string::_M_construct<char8_t_const*>
            ((u8string *)&local_50,args->_M_str,args->_M_str + args->_M_len);
  local_50.m_properties = normal;
  local_50.m_color.m_value = 0;
  local_50.m_color_bg.m_value = 0;
  __l._M_len = 1;
  __l._M_array = &local_50;
  std::vector<jessilib::io::text,_std::allocator<jessilib::io::text>_>::vector
            (&this->m_message,__l,&local_51);
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)local_50.m_string._M_dataplus._M_p != paVar1) {
    operator_delete(local_50.m_string._M_dataplus._M_p,
                    local_50.m_string.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

formatted_message(std::u8string in_format, Args&& ... args)
		: m_format{ std::move(in_format) },
		m_message{ std::forward<Args>(args)... } {
		// Empty ctor body
	}